

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::GetOwnPropertyInfoAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  PropertyId propertyId;
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *argAction;
  TTDVar origVar;
  RecyclableObject *pRVar4;
  ScriptContext *pSVar5;
  JavascriptLibrary *this;
  undefined4 *puVar6;
  undefined1 local_70 [8];
  PropertyDescriptor propertyDescriptorValue;
  Var res;
  RecyclableObject *__obj;
  Var var;
  JsRTSingleVarScalarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)53>
                        (evt);
  origVar = GetVarItem_0<1ul,1ul>(argAction);
  __obj = (RecyclableObject *)InflateVarInReplay(executeContext,origVar);
  if ((__obj != (RecyclableObject *)0x0) &&
     (BVar3 = Js::JavascriptOperators::IsObject(__obj), BVar3 != 0)) {
    pRVar4 = Js::VarTo<Js::RecyclableObject>(__obj);
    pSVar5 = Js::RecyclableObject::GetScriptContext(pRVar4);
    if (pSVar5 != scriptContext) {
      __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
    }
    propertyDescriptorValue.Configurable = false;
    propertyDescriptorValue.fromProxy = false;
    propertyDescriptorValue._42_6_ = 0;
    Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_70);
    pRVar4 = Js::VarTo<Js::RecyclableObject>(__obj);
    propertyId = GetPropertyIdItem<1ul,1ul>(argAction);
    BVar3 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                      (pRVar4,propertyId,scriptContext,(PropertyDescriptor *)local_70);
    if (BVar3 == 0) {
      this = Js::ScriptContext::GetLibrary(scriptContext);
      propertyDescriptorValue._40_8_ =
           Js::JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
    }
    else {
      propertyDescriptorValue._40_8_ =
           Js::JavascriptOperators::FromPropertyDescriptor
                     ((PropertyDescriptor *)local_70,scriptContext);
    }
    if ((propertyDescriptorValue._40_8_ != 0) &&
       (BVar3 = Js::CrossSite::NeedMarshalVar((Var)propertyDescriptorValue._40_8_,scriptContext),
       BVar3 != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                         ,0x273,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))",
                         "res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)53>
              (executeContext,evt,(Var)propertyDescriptorValue._40_8_);
  }
  return;
}

Assistant:

void GetOwnPropertyInfoAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarScalarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarScalarArgumentAction, EventKind::GetOwnPropertyInfoActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::Var res = nullptr;
            Js::PropertyDescriptor propertyDescriptorValue;
            if(Js::JavascriptOperators::GetOwnPropertyDescriptor(Js::VarTo<Js::RecyclableObject>(var), GetPropertyIdItem(action), ctx, &propertyDescriptorValue))
            {
                res = Js::JavascriptOperators::FromPropertyDescriptor(propertyDescriptorValue, ctx);
            }
            else
            {
                res = ctx->GetLibrary()->GetUndefined();
            }
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarScalarArgumentAction, EventKind::GetOwnPropertyInfoActionTag>(executeContext, evt, res);
        }